

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O3

void __thiscall wasm::OptimizeAddedConstants::createHelperIndexes(OptimizeAddedConstants *this)

{
  undefined1 auStack_f8 [8];
  Creator creator;
  
  creator.super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>.
  super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.currModule = (Module *)&this->helperIndexes;
  auStack_f8 = (undefined1  [8])0x0;
  creator.super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>.
  super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.replacep = (Expression **)0x0;
  creator.super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>.
  super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack.fixed._M_elems[9].currp =
       (Expression **)0x0;
  creator.super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>.
  super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Creator,_wasm::Visitor<Creator,_void>_>::Task,_std::allocator<wasm::Walker<Creator,_wasm::Visitor<Creator,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  creator.super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>.
  super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Creator,_wasm::Visitor<Creator,_void>_>::Task,_std::allocator<wasm::Walker<Creator,_wasm::Visitor<Creator,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  creator.super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>.
  super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Creator,_wasm::Visitor<Creator,_void>_>::Task,_std::allocator<wasm::Walker<Creator,_wasm::Visitor<Creator,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  creator.super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>.
  super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.currFunction = (Function *)0x0;
  creator.helperIndexes =
       (map<wasm::LocalSet_*,_unsigned_int,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
        *)(this->
          super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
          ).
          super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
          .
          super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
          .currModule;
  Walker<Creator,_wasm::Visitor<Creator,_void>_>::walk
            ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)auStack_f8,
             &((this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
               .
               super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
              .currFunction)->body);
  if (creator.super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>.
      super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack.fixed._M_elems[9].currp !=
      (Expression **)0x0) {
    operator_delete(creator.super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>.
                    super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack.fixed._M_elems[9].
                    currp,(long)creator.super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>.
                                super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack.flexible.
                                super__Vector_base<wasm::Walker<Creator,_wasm::Visitor<Creator,_void>_>::Task,_std::allocator<wasm::Walker<Creator,_wasm::Visitor<Creator,_void>_>::Task>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)creator.super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>.
                                super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack.fixed.
                                _M_elems[9].currp);
  }
  return;
}

Assistant:

void createHelperIndexes() {
    struct Creator : public PostWalker<Creator> {
      std::map<LocalSet*, Index>& helperIndexes;
      Module* module;

      Creator(std::map<LocalSet*, Index>& helperIndexes)
        : helperIndexes(helperIndexes) {}

      void visitLocalSet(LocalSet* curr) {
        auto iter = helperIndexes.find(curr);
        if (iter != helperIndexes.end()) {
          auto index = iter->second;
          auto* binary = curr->value->cast<Binary>();
          Expression** target;
          if (binary->left->is<Const>()) {
            target = &binary->right;
          } else {
            assert(binary->right->is<Const>());
            target = &binary->left;
          }
          auto* value = *target;
          Builder builder(*module);
          *target = builder.makeLocalGet(index, Type::i32);
          replaceCurrent(
            builder.makeSequence(builder.makeLocalSet(index, value), curr));
        }
      }
    } creator(helperIndexes);
    creator.module = getModule();
    creator.walk(getFunction()->body);
  }